

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

QByteArray *
makeCacheKey(QByteArray *__return_storage_ptr__,QUrl *url,QNetworkProxy *proxy,
            QString *peerVerifyName)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  ProxyType PVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QByteArrayView QVar9;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  qsizetype qStack_100;
  QStringBuilder<const_char_(&)[17],_QByteArray> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QUrl key;
  QArrayDataPointer<char16_t> local_78;
  QUrl copy;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  copy.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&copy,url);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::scheme();
  local_e8.a = (char (*) [17])0x5;
  local_e8.b.d.d = (Data *)0x23dd27;
  bVar4 = operator==((QString *)&local_78,(QLatin1StringView *)&local_e8);
  if (!bVar4) {
    local_98.d = (Data *)0x10;
    local_98.ptr = L"preconnect-https";
    operator==((QString *)&local_78,(QLatin1StringView *)&local_98);
  }
  QVar8.m_data = (char *)0x4;
  QVar8.m_size = (qsizetype)&local_78;
  cVar5 = QString::startsWith(QVar8,0x23dd48);
  if (cVar5 == '\0') {
    QUrl::port((int)&copy);
    QUrl::setPort((int)&copy);
  }
  local_e8.a = (char (*) [17])0xf;
  local_e8.b.d.d = (Data *)0x23dd2d;
  bVar4 = operator==((QString *)&local_78,(QLatin1StringView *)&local_e8);
  if (bVar4) {
    pcVar7 = "http";
    qStack_100 = 4;
LAB_001f9862:
    latin1.m_data = pcVar7;
    latin1.m_size = qStack_100;
    QString::QString((QString *)&local_e8,latin1);
    QUrl::setScheme((QString *)&copy);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  else {
    local_e8.a = (char (*) [17])0x10;
    local_e8.b.d.d = (Data *)0x23dd1c;
    bVar4 = operator==((QString *)&local_78,(QLatin1StringView *)&local_e8);
    if (bVar4) {
      pcVar7 = "https";
      qStack_100 = 5;
      goto LAB_001f9862;
    }
  }
  QUrl::toString(&local_e8,&copy,0x1f000e6);
  local_58.ptr = (char16_t *)local_e8.b.d.d;
  local_58.d = (Data *)local_e8.a;
  local_e8.a = (char (*) [17])0x0;
  local_e8.b.d.d = (Data *)0x0;
  local_58.size = (qsizetype)local_e8.b.d.ptr;
  local_e8.b.d.ptr = (char *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  if ((proxy == (QNetworkProxy *)0x0) || (PVar6 = QNetworkProxy::type(proxy), PVar6 == NoProxy))
  goto LAB_001f9ad4;
  key.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&key);
  PVar6 = QNetworkProxy::type(proxy);
  if (PVar6 - HttpProxy < 2) {
    pcVar7 = "proxy-http";
    qStack_100 = 10;
LAB_001f9927:
    latin1_00.m_data = pcVar7;
    latin1_00.m_size = qStack_100;
    QString::QString((QString *)&local_e8,latin1_00);
    QUrl::setScheme((QString *)&key);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  else if (PVar6 == Socks5Proxy) {
    pcVar7 = "proxy-socks5";
    qStack_100 = 0xc;
    goto LAB_001f9927;
  }
  QUrl::scheme();
  pcVar7 = local_e8.b.d.ptr;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  if (pcVar7 != (char *)0x0) {
    local_e8.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_e8.a = (char (*) [17])&DAT_aaaaaaaaaaaaaaaa;
    local_e8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkProxy::password((QString *)&local_c8,proxy);
    QString::toUtf8_helper((QString *)&local_b0);
    QVar9.m_data = (storage_type *)local_b0.size;
    QVar9.m_size = (qsizetype)&local_98;
    QCryptographicHash::hash(QVar9,(Algorithm)local_b0.ptr);
    QByteArray::toHex((char)&local_e8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QNetworkProxy::user((QString *)&local_98,proxy);
    QUrl::setUserName((QString *)&key,(ParsingMode)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QString::fromUtf8<void>((QString *)&local_98,(QByteArray *)&local_e8);
    QUrl::setPassword((QString *)&key,(ParsingMode)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QNetworkProxy::hostName((QString *)&local_98,proxy);
    QUrl::setHost((QString *)&key,(ParsingMode)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QNetworkProxy::port(proxy);
    QUrl::setPort((int)&key);
    QUrl::setQuery((QString *)&key,(ParsingMode)&local_58);
    QUrl::toString(&local_98,&key,0x1f00000);
    qVar3 = local_58.size;
    pcVar2 = local_58.ptr;
    pDVar1 = local_58.d;
    local_58.d = local_98.d;
    local_58.ptr = local_98.ptr;
    local_98.d = pDVar1;
    local_98.ptr = pcVar2;
    local_58.size = local_98.size;
    local_98.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_e8);
  }
  QUrl::~QUrl(&key);
LAB_001f9ad4:
  if ((peerVerifyName->d).size != 0) {
    local_e8.a = (char (*) [17])CONCAT62(local_e8.a._2_6_,0x3a);
    local_e8.b.d.d = (Data *)peerVerifyName;
    operator+=((QString *)&local_58,(QStringBuilder<char16_t,_const_QString_&> *)&local_e8);
  }
  QString::toLatin1_helper_inplace((QString *)&local_98);
  local_e8.b.d.size = local_98.size;
  local_e8.b.d.ptr = (char *)local_98.ptr;
  local_e8.b.d.d = (Data *)local_98.d;
  local_e8.a = (char (*) [17])0x24f993;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QStringBuilder<const_char_(&)[17],_QByteArray>::convertTo<QByteArray>
            (__return_storage_ptr__,&local_e8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_e8.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QUrl::~QUrl(&copy);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QByteArray makeCacheKey(QUrl &url, QNetworkProxy *proxy, const QString &peerVerifyName)
{
    QString result;
    QUrl copy = url;
    QString scheme = copy.scheme();
    bool isEncrypted = scheme == "https"_L1 || scheme == "preconnect-https"_L1;
    const bool isLocalSocket = scheme.startsWith("unix"_L1);
    if (!isLocalSocket)
        copy.setPort(copy.port(isEncrypted ? 443 : 80));
    if (scheme == "preconnect-http"_L1)
        copy.setScheme("http"_L1);
    else if (scheme == "preconnect-https"_L1)
        copy.setScheme("https"_L1);
    result = copy.toString(QUrl::RemoveUserInfo | QUrl::RemovePath |
                           QUrl::RemoveQuery | QUrl::RemoveFragment | QUrl::FullyEncoded);

#ifndef QT_NO_NETWORKPROXY
    if (proxy && proxy->type() != QNetworkProxy::NoProxy) {
        QUrl key;

        switch (proxy->type()) {
        case QNetworkProxy::Socks5Proxy:
            key.setScheme("proxy-socks5"_L1);
            break;

        case QNetworkProxy::HttpProxy:
        case QNetworkProxy::HttpCachingProxy:
            key.setScheme("proxy-http"_L1);
            break;

        default:
            break;
        }

        if (!key.scheme().isEmpty()) {
            const QByteArray obfuscatedPassword = QCryptographicHash::hash(proxy->password().toUtf8(),
                                                                           QCryptographicHash::Sha1).toHex();
            key.setUserName(proxy->user());
            key.setPassword(QString::fromUtf8(obfuscatedPassword));
            key.setHost(proxy->hostName());
            key.setPort(proxy->port());
            key.setQuery(result);
            result = key.toString(QUrl::FullyEncoded);
        }
    }
#else
    Q_UNUSED(proxy);
#endif
    if (!peerVerifyName.isEmpty())
        result += u':' + peerVerifyName;
    return "http-connection:" + std::move(result).toLatin1();
}